

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O3

void deqp::gls::RandomArrayGenerator::setData
               (char *data,InputType type,deRandom *rnd,GLValue min,GLValue max)

{
  ushort uVar1;
  deUint32 dVar2;
  Float<unsigned_int,_8,_23,_127,_3U> FVar3;
  Float<unsigned_int,_8,_23,_127,_3U> FVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  byte bVar8;
  int iVar9;
  Float<unsigned_short,_5,_10,_15,_1U> FVar10;
  float fVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  Float<unsigned_short,_5,_10,_15,_3U> local_2c;
  Float<unsigned_short,_5,_10,_15,_3U> local_2a;
  Float<unsigned_short,_5,_10,_15,_3U> local_28;
  Float<unsigned_short,_5,_10,_15,_3U> local_26;
  Float<unsigned_int,_8,_23,_127,_3U> local_24;
  
  uVar6 = min.field_1._1_4_;
  bVar8 = min.field_1._0_1_;
  iVar9 = min.field_1._2_4_;
  uVar12 = min.field_1._0_4_;
  uVar1 = max.field_1._0_2_;
  fVar13 = max.field_1._0_4_;
  switch(type) {
  case INPUTTYPE_FLOAT:
    fVar11 = (float)((uVar6 & 0xff) << 8 | uVar12 & 0xff | iVar9 << 0x10);
    if (fVar11 <= fVar13) {
      fVar14 = deRandom_getFloat(rnd);
      fVar11 = fVar11 + (fVar13 - fVar11) * fVar14;
    }
    *(float *)data = fVar11;
    break;
  case INPUTTYPE_FIXED:
  case INPUTTYPE_INT:
    fVar11 = (float)((uVar6 & 0xff) << 8 | uVar12 & 0xff | iVar9 << 0x10);
    uVar12 = (int)fVar13 - (int)fVar11;
    if (uVar12 != 0 && (int)fVar11 <= (int)fVar13) {
LAB_0185195d:
      dVar2 = deRandom_getUint32(rnd);
      fVar11 = (float)((int)fVar11 + dVar2 % uVar12);
    }
    goto LAB_0185196c;
  case INPUTTYPE_DOUBLE:
    fVar11 = (float)((uVar6 & 0xff) << 8 | uVar12 & 0xff | iVar9 << 0x10);
    if (fVar11 <= fVar13) {
      fVar14 = deRandom_getFloat(rnd);
      fVar11 = fVar11 + (fVar13 - fVar11) * fVar14;
    }
    *(double *)data = (double)fVar11;
    break;
  case INPUTTYPE_BYTE:
    uVar12 = (uint)(char)max.field_1.b.m_value;
    if ((char)bVar8 < (char)max.field_1.fi.m_value._0_1_) {
      uVar6 = deRandom_getUint32(rnd);
      uVar7 = (uint)(char)bVar8;
LAB_01851b37:
      bVar8 = (char)(uVar6 % (uVar12 - uVar7)) + bVar8;
    }
    goto LAB_01851b43;
  case INPUTTYPE_SHORT:
    FVar10.m_value = min.field_1._0_2_ & 0xff | (ushort)(uVar6 << 8);
    uVar7 = (uint)(short)uVar1;
    if ((short)FVar10.m_value < (short)uVar1) {
      uVar5 = deRandom_getUint32(rnd);
      uVar12 = (uint)(short)FVar10.m_value;
LAB_01851b11:
      FVar10.m_value = (short)(uVar5 % (uVar7 - uVar12)) + FVar10.m_value;
    }
    goto LAB_01851b1d;
  case INPUTTYPE_UNSIGNED_BYTE:
    uVar12 = (uint)(byte)max.field_1.b.m_value;
    if (bVar8 < (byte)max.field_1.us.m_value._0_1_) {
      uVar6 = deRandom_getUint32(rnd);
      uVar7 = (uint)bVar8;
      goto LAB_01851b37;
    }
LAB_01851b43:
    *data = bVar8;
    break;
  case INPUTTYPE_UNSIGNED_SHORT:
    FVar10.m_value = (ushort)(uVar12 & 0xff) | (ushort)(uVar6 << 8);
    uVar7 = (uint)uVar1;
    if (FVar10.m_value < uVar1) {
      uVar5 = deRandom_getUint32(rnd);
      uVar12 = uVar12 & 0xff | uVar6 << 8 & 0xffff;
      goto LAB_01851b11;
    }
    goto LAB_01851b1d;
  case INPUTTYPE_UNSIGNED_INT:
    fVar11 = (float)((uVar6 & 0xff) << 8 | uVar12 & 0xff | iVar9 << 0x10);
    uVar12 = (int)fVar13 - (int)fVar11;
    if ((uint)fVar11 <= (uint)fVar13 && uVar12 != 0) goto LAB_0185195d;
LAB_0185196c:
    *(float *)data = fVar11;
    break;
  case INPUTTYPE_HALF:
    FVar10.m_value = min.field_1._0_2_ & 0xff | (ushort)(uVar6 << 8);
    local_2c.m_value = uVar1;
    FVar3 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>(&local_2c);
    local_2a.m_value = FVar10.m_value;
    FVar4 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>(&local_2a);
    if ((float)FVar4.m_value <= (float)FVar3.m_value) {
      local_28.m_value = uVar1;
      FVar3 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>(&local_28);
      local_26.m_value = FVar10.m_value;
      FVar4 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>(&local_26);
      fVar13 = deRandom_getFloat(rnd);
      local_24.m_value =
           (StorageType)(((float)FVar3.m_value - (float)FVar4.m_value) * fVar13 + FVar4.m_value);
      FVar10 = tcu::Float<unsigned_short,5,10,15,1u>::convert<unsigned_int,8,23,127,3u>(&local_24);
    }
LAB_01851b1d:
    *(StorageType_conflict *)data = FVar10.m_value;
  }
  return;
}

Assistant:

void RandomArrayGenerator::setData (char* data, Array::InputType type, deRandom& rnd, GLValue min, GLValue max)
{
	switch (type)
	{
		case Array::INPUTTYPE_FLOAT:
		{
			alignmentSafeAssignment<float>(data, getRandom<GLValue::Float>(rnd, min.fl, max.fl));
			break;
		}

		case Array::INPUTTYPE_DOUBLE:
		{
			alignmentSafeAssignment<double>(data, getRandom<GLValue::Float>(rnd, min.fl, max.fl));
			break;
		}

		case Array::INPUTTYPE_SHORT:
		{
			alignmentSafeAssignment<deInt16>(data, getRandom<GLValue::Short>(rnd, min.s, max.s));
			break;
		}

		case Array::INPUTTYPE_UNSIGNED_SHORT:
		{
			alignmentSafeAssignment<deUint16>(data, getRandom<GLValue::Ushort>(rnd, min.us, max.us));
			break;
		}

		case Array::INPUTTYPE_BYTE:
		{
			alignmentSafeAssignment<deInt8>(data, getRandom<GLValue::Byte>(rnd, min.b, max.b));
			break;
		}

		case Array::INPUTTYPE_UNSIGNED_BYTE:
		{
			alignmentSafeAssignment<deUint8>(data, getRandom<GLValue::Ubyte>(rnd, min.ub, max.ub));
			break;
		}

		case Array::INPUTTYPE_FIXED:
		{
			alignmentSafeAssignment<deInt32>(data, getRandom<GLValue::Fixed>(rnd, min.fi, max.fi));
			break;
		}

		case Array::INPUTTYPE_INT:
		{
			alignmentSafeAssignment<deInt32>(data, getRandom<GLValue::Int>(rnd, min.i, max.i));
			break;
		}

		case Array::INPUTTYPE_UNSIGNED_INT:
		{
			alignmentSafeAssignment<deUint32>(data, getRandom<GLValue::Uint>(rnd, min.ui, max.ui));
			break;
		}

		case Array::INPUTTYPE_HALF:
		{
			alignmentSafeAssignment<deFloat16>(data, getRandom<GLValue::Half>(rnd, min.h, max.h).getValue());
			break;
		}

		default:
			DE_ASSERT(false);
			break;
	}
}